

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnRevSubClampPalCommand::Execute
          (DrawColumnRevSubClampPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  byte *pbVar11;
  uint uVar12;
  
  puVar3 = (this->super_PalColumnCommand)._dest;
  iVar1 = (this->super_PalColumnCommand)._iscale;
  iVar9 = (this->super_PalColumnCommand)._texturefrac;
  iVar7 = DrawerThread::count_for_thread
                    (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                     *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc);
  if (0 < iVar7) {
    iVar2 = (this->super_PalColumnCommand)._pitch;
    iVar8 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y);
    pbVar11 = puVar3 + iVar8 * iVar2;
    iVar8 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y);
    iVar9 = iVar8 * iVar1 + iVar9;
    iVar8 = thread->num_cores;
    puVar3 = (this->super_PalColumnCommand)._colormap;
    puVar4 = (this->super_PalColumnCommand)._source;
    puVar5 = (this->super_PalColumnCommand)._srcblend;
    puVar6 = (this->super_PalColumnCommand)._destblend;
    do {
      uVar10 = (puVar6[*pbVar11] | 0x40100400) - puVar5[puVar3[puVar4[iVar9 >> 0x10]]];
      uVar12 = uVar10 & 0x40100400;
      uVar10 = uVar12 - (uVar12 >> 5) & uVar10 | 0x1f07c1f;
      *pbVar11 = RGB32k.All[uVar10 >> 0xf & uVar10];
      pbVar11 = pbVar11 + iVar8 * iVar2;
      iVar9 = iVar9 + iVar1 * iVar8;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  return;
}

Assistant:

void DrawColumnRevSubClampPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;
		fixed_t frac;
		fixed_t fracstep;

		count = _count;
		dest = _dest;

		fracstep = _iscale;
		frac = _texturefrac;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		const uint8_t *colormap = _colormap;
		const uint8_t *source = _source;
		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		do
		{
			uint32_t a = (bg2rgb[*dest] | 0x40100400) - fg2rgb[colormap[source[frac >> FRACBITS]]];
			uint32_t b = a;

			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			*dest = RGB32k.All[a & (a >> 15)];
			dest += pitch;
			frac += fracstep;
		} while (--count);
	}